

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 getSafetyLevel(char *z,int omitFull,u8 dflt)

{
  uint uVar1;
  ulong in_RAX;
  size_t sVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  uchar uVar4;
  uchar uVar5;
  long lVar6;
  uint uVar7;
  int x;
  undefined8 local_38;
  
  if ((ulong)(byte)*z - 0x3a < 0xfffffffffffffff6) {
    local_38 = CONCAT44((int)(in_RAX >> 0x20),(int)CONCAT71(in_register_00000011,dflt));
    sVar2 = strlen(z);
    uVar1 = (uint)sVar2 & 0x3fffffff;
    uVar3 = 0;
    do {
      if (uVar1 == "\x02\x02\x03\x05\x03\x04\x05\x04"[uVar3]) {
        if ((sVar2 & 0x3fffffff) != 0) {
          lVar6 = 0;
          uVar7 = uVar1 + 1;
          do {
            if ((ulong)(byte)"onoffalseyestruextrafull"[(ulong)""[uVar3] + lVar6] == 0) {
              uVar5 = ""[(byte)z[lVar6]];
              uVar4 = '\0';
LAB_0019c301:
              if (uVar4 != uVar5) goto LAB_0019c319;
              break;
            }
            uVar4 = ""[(byte)"onoffalseyestruextrafull"[(ulong)""[uVar3] + lVar6]];
            uVar5 = ""[(byte)z[lVar6]];
            if (uVar4 != uVar5) goto LAB_0019c301;
            uVar7 = uVar7 - 1;
            lVar6 = lVar6 + 1;
          } while (1 < uVar7);
        }
        if ((omitFull == 0) || ((uVar3 | 0xfffffff8) < 0xfffffffe)) {
          return "\x01"[uVar3];
        }
      }
LAB_0019c319:
      uVar3 = uVar3 + 1;
    } while (uVar3 != 8);
    local_38._4_1_ = (u8)local_38;
  }
  else {
    local_38 = in_RAX & 0xffffffff;
    sqlite3GetInt32(z,(int *)((long)&local_38 + 4));
  }
  return local_38._4_1_;
}

Assistant:

static u8 getSafetyLevel(const char *z, int omitFull, u8 dflt){
                             /* 123456789 123456789 123 */
  static const char zText[] = "onoffalseyestruextrafull";
  static const u8 iOffset[] = {0, 1, 2,  4,    9,  12,  15,   20};
  static const u8 iLength[] = {2, 2, 3,  5,    3,   4,   5,    4};
  static const u8 iValue[] =  {1, 0, 0,  0,    1,   1,   3,    2};
                            /* on no off false yes true extra full */
  int i, n;
  if( sqlite3Isdigit(*z) ){
    return (u8)sqlite3Atoi(z);
  }
  n = sqlite3Strlen30(z);
  for(i=0; i<ArraySize(iLength); i++){
    if( iLength[i]==n && sqlite3StrNICmp(&zText[iOffset[i]],z,n)==0
     && (!omitFull || iValue[i]<=1)
    ){
      return iValue[i];
    }
  }
  return dflt;
}